

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O3

int __thiscall ncnn::ReLU_x86::forward_inplace(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar6 = bottom_top_blob->elempack;
  if ((iVar6 == 0) || (iVar2 = (int)bottom_top_blob->elemsize << 3, iVar2 / iVar6 != 8)) {
    uVar1 = bottom_top_blob->c;
    uVar3 = iVar6 * bottom_top_blob->w * bottom_top_blob->h * bottom_top_blob->d;
    if ((this->super_ReLU).slope == 0.0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          pauVar5 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          if ((int)uVar3 < 4) {
            uVar7 = 0;
          }
          else {
            iVar6 = 3;
            do {
              auVar10 = maxps(*pauVar5,ZEXT816(0));
              *pauVar5 = auVar10;
              pauVar5 = pauVar5 + 1;
              iVar6 = iVar6 + 4;
              uVar7 = uVar3 & 0xfffffffc;
            } while (iVar6 < (int)uVar3);
          }
          if (uVar3 - uVar7 != 0 && (int)uVar7 <= (int)uVar3) {
            lVar8 = 0;
            do {
              fVar9 = *(float *)(*pauVar5 + lVar8 * 4);
              if (fVar9 <= 0.0) {
                fVar9 = 0.0;
              }
              *(float *)(*pauVar5 + lVar8 * 4) = fVar9;
              lVar8 = lVar8 + 1;
            } while (uVar3 - uVar7 != (int)lVar8);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        pauVar5 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar3 < 4) {
          uVar7 = 0;
        }
        else {
          fVar9 = (this->super_ReLU).slope;
          iVar6 = 3;
          do {
            auVar11 = maxps(*pauVar5,ZEXT816(0));
            auVar10 = minps(*pauVar5,ZEXT816(0));
            *(float *)*pauVar5 = auVar10._0_4_ * fVar9 + auVar11._0_4_;
            *(float *)(*pauVar5 + 4) = auVar10._4_4_ * fVar9 + auVar11._4_4_;
            *(float *)(*pauVar5 + 8) = auVar10._8_4_ * fVar9 + auVar11._8_4_;
            *(float *)(*pauVar5 + 0xc) = auVar10._12_4_ * fVar9 + auVar11._12_4_;
            pauVar5 = pauVar5 + 1;
            iVar6 = iVar6 + 4;
            uVar7 = uVar3 & 0xfffffffc;
          } while (iVar6 < (int)uVar3);
        }
        if (uVar3 - uVar7 != 0 && (int)uVar7 <= (int)uVar3) {
          lVar8 = 0;
          do {
            if (*(float *)(*pauVar5 + lVar8 * 4) < 0.0) {
              *(float *)(*pauVar5 + lVar8 * 4) =
                   *(float *)(*pauVar5 + lVar8 * 4) * (this->super_ReLU).slope;
            }
            lVar8 = lVar8 + 1;
          } while (uVar3 - uVar7 != (int)lVar8);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar2 % (long)iVar6 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}